

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateRecorder::record_compute_pipeline
          (StateRecorder *this,VkPipeline pipeline,VkComputePipelineCreateInfo *create_info,
          VkPipeline *base_pipelines,uint32_t base_pipeline_count,Hash custom_hash,VkDevice device,
          PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii)

{
  bool bVar1;
  int iVar2;
  VkBaseInStructure *base_in_1;
  int *piVar3;
  mutex *pmVar4;
  VkComputePipelineCreateInfo *new_info;
  WorkItem local_50;
  
  for (piVar3 = (int *)create_info->pNext; piVar3 != (int *)0x0; piVar3 = *(int **)(piVar3 + 2)) {
    if (*piVar3 == 0x3ba228ba) {
      if (piVar3[4] != 0) {
        return true;
      }
      break;
    }
  }
  if ((create_info->stage).module == (VkShaderModule)0x0) {
    for (piVar3 = (int *)(create_info->stage).pNext; piVar3 != (int *)0x0;
        piVar3 = *(int **)(piVar3 + 2)) {
      if (*piVar3 == 0x10) goto LAB_0015eb17;
    }
    if (this->impl->should_record_identifier_only == false) {
      pmVar4 = &this->impl->record_lock;
      iVar2 = pthread_mutex_lock((pthread_mutex_t *)pmVar4);
      if (iVar2 == 0) {
        if (pipeline != (VkPipeline)0x0) {
          Impl::push_unregister_locked<VkPipeline_T*>
                    (this->impl,VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO,pipeline);
        }
        pthread_mutex_unlock((pthread_mutex_t *)pmVar4);
        return true;
      }
      goto LAB_0015ec31;
    }
  }
LAB_0015eb17:
  pmVar4 = &this->impl->record_lock;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)pmVar4);
  if (iVar2 == 0) {
    new_info = (VkComputePipelineCreateInfo *)0x0;
    bVar1 = Impl::copy_compute_pipeline
                      (this->impl,create_info,&this->impl->temp_allocator,base_pipelines,
                       base_pipeline_count,device,gsmcii,&new_info);
    if (bVar1) {
      local_50.type = VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO;
      local_50.create_info = new_info;
      local_50.handle = (uint64_t)pipeline;
      local_50.custom_hash = custom_hash;
      Impl::push_work_locked(this->impl,&local_50);
      pthread_mutex_unlock((pthread_mutex_t *)pmVar4);
      Impl::pump_synchronized_recording(this->impl,this);
      return true;
    }
    if (pipeline != (VkPipeline)0x0) {
      Impl::push_unregister_locked<VkPipeline_T*>
                (this->impl,VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO,pipeline);
    }
    pthread_mutex_unlock((pthread_mutex_t *)pmVar4);
    return false;
  }
LAB_0015ec31:
  std::__throw_system_error(iVar2);
}

Assistant:

bool StateRecorder::record_compute_pipeline(VkPipeline pipeline, const VkComputePipelineCreateInfo &create_info,
                                            const VkPipeline *base_pipelines, uint32_t base_pipeline_count,
                                            Hash custom_hash,
                                            VkDevice device,
                                            PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii)
{
	// Silently ignore if we have pipeline binaries.
	// We have no way of recording these unless we go the extra mile to
	// override the global key and add extra metadata blocks.
	// Hopefully applications are well-behaved ...
	auto *binaries = find_pnext<VkPipelineBinaryInfoKHR>(VK_STRUCTURE_TYPE_PIPELINE_BINARY_INFO_KHR, create_info.pNext);
	if (binaries && binaries->binaryCount)
		return true;

	// Ignore pipelines that cannot result in meaningful replay.
	// If we are using module identifier data + on use, we need to push it for record.
	if (shader_stage_is_identifier_only(create_info.stage) &&
	    !impl->should_record_identifier_only)
	{
		std::lock_guard<std::mutex> lock(impl->record_lock);
		// Have to forget any reference if this API handle is recycled.
		if (pipeline != VK_NULL_HANDLE)
			impl->push_unregister_locked(VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO, pipeline);
		return true;
	}

	{
		std::lock_guard<std::mutex> lock(impl->record_lock);

		VkComputePipelineCreateInfo *new_info = nullptr;
		if (!impl->copy_compute_pipeline(&create_info, impl->temp_allocator,
		                                 base_pipelines, base_pipeline_count,
		                                 device, gsmcii,
		                                 &new_info))
		{
			// Have to forget any reference if this API handle is recycled.
			if (pipeline != VK_NULL_HANDLE)
				impl->push_unregister_locked(VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO, pipeline);
			return false;
		}

		impl->push_work_locked({VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO, api_object_cast<uint64_t>(pipeline),
		                        new_info, custom_hash});
	}

	impl->pump_synchronized_recording(this);
	return true;
}